

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O3

void __thiscall
llm_tokenizer_bpe_session::check_double_bos_eos
          (llm_tokenizer_bpe_session *this,vector<int,_std::allocator<int>_> *output)

{
  pointer piVar1;
  _Head_base<0UL,_llama_vocab::impl_*,_false> _Var2;
  
  _Var2._M_head_impl =
       (this->vocab->pimpl)._M_t.
       super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t.
       super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
       super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl;
  if (((*(char *)((long)_Var2._M_head_impl + 0x4d) == '\x01') &&
      (piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start,
      4 < (ulong)((long)(output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar1))) &&
     (piVar1[1] == *(int *)((long)_Var2._M_head_impl + 0x10))) {
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "%s: Added a BOS token to the prompt as specified by the model but the prompt also starts with a BOS token. So now the final prompt starts with 2 BOS tokens. Are you sure this is what you want?\n"
                       ,"check_double_bos_eos");
    _Var2._M_head_impl =
         (this->vocab->pimpl)._M_t.
         super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t.
         super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
         super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl;
  }
  if ((((_Var2._M_head_impl)->add_eos == true) &&
      (piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish,
      4 < (ulong)((long)piVar1 -
                 (long)(output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start))) &&
     (piVar1[-2] == (_Var2._M_head_impl)->special_eos_id)) {
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "%s: Added a EOS token to the prompt as specified by the model but the prompt also ends with a EOS token. So now the final prompt ends with 2 EOS tokens. Are you sure this is what you want?\n"
                       ,"check_double_bos_eos");
    return;
  }
  return;
}

Assistant:

void check_double_bos_eos(const std::vector<llama_token> & output) const {
        if (vocab.get_add_bos() && output.size() >= 2 && output[1] == vocab.token_bos()) {
            LLAMA_LOG_WARN(
                "%s: Added a BOS token to the prompt as specified by the model but the prompt "
                "also starts with a BOS token. So now the final prompt starts with 2 BOS tokens. "
                "Are you sure this is what you want?\n", __FUNCTION__);
        }
        if (vocab.get_add_eos() && output.size() >= 2 && *(output.end()-2) == vocab.token_eos()) {
            LLAMA_LOG_WARN(
                "%s: Added a EOS token to the prompt as specified by the model but the prompt "
                "also ends with a EOS token. So now the final prompt ends with 2 EOS tokens. "
                "Are you sure this is what you want?\n", __FUNCTION__);
        }
    }